

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::SegmentBase<Memory::VirtualAllocWrapper>::~SegmentBase
          (SegmentBase<Memory::VirtualAllocWrapper> *this)

{
  uint uVar1;
  char *pcVar2;
  code *pcVar3;
  bool bVar4;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *pPVar5;
  VirtualAllocWrapper *this_00;
  size_t sVar6;
  undefined8 *in_FS_OFFSET;
  char *originalAddress;
  SegmentBase<Memory::VirtualAllocWrapper> *this_local;
  
  if ((this->super_SegmentBaseCommon).allocator == (PageAllocatorBaseCommon *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x39,"(this->allocator != nullptr)","this->allocator != nullptr");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (this->secondaryAllocator != (SecondaryAllocator *)0x0) {
    (*this->secondaryAllocator->_vptr_SecondaryAllocator[2])();
    this->secondaryAllocator = (SecondaryAllocator *)0x0;
  }
  if (this->address != (char *)0x0) {
    pcVar2 = this->address;
    uVar1 = this->leadingGuardPageCount;
    pPVar5 = GetAllocator(this);
    this_00 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ::GetVirtualAllocator(pPVar5);
    sVar6 = GetPageCount(this);
    VirtualAllocWrapper::Free(this_00,pcVar2 + -(ulong)(uVar1 << 0xc),sVar6 << 0xc,0x8000);
    pPVar5 = GetAllocator(this);
    PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
    ::ReportFree(pPVar5,this->segmentPageCount << 0xc);
    if (((Js::Configuration::Global[0x2c154] & 1) != 0) && (((byte)this->field_0x2c >> 1 & 1) != 0))
    {
      RecyclerWriteBarrierManager::ToggleBarrier(this->address,this->segmentPageCount << 0xc,false);
    }
    RecyclerWriteBarrierManager::OnSegmentFree(this->address,this->segmentPageCount);
  }
  SegmentBaseCommon::~SegmentBaseCommon(&this->super_SegmentBaseCommon);
  return;
}

Assistant:

SegmentBase<T>::~SegmentBase()
{
    Assert(this->allocator != nullptr);

    // Cleanup secondaryAllocator before releasing pages so the destructor
    // still has access to segment memory.
    if(this->secondaryAllocator)
    {
        this->secondaryAllocator->Delete();
        this->secondaryAllocator = nullptr;
    }

    if (this->address)
    {
        char* originalAddress = this->address - (leadingGuardPageCount * AutoSystemInfo::PageSize);
        GetAllocator()->GetVirtualAllocator()->Free(originalAddress, GetPageCount() * AutoSystemInfo::PageSize, MEM_RELEASE);
        GetAllocator()->ReportFree(this->segmentPageCount * AutoSystemInfo::PageSize); //Note: We reported the guard pages free when we decommitted them during segment initialization
#if defined(TARGET_64) && defined(RECYCLER_WRITE_BARRIER_BYTE)
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (CONFIG_FLAG(StrictWriteBarrierCheck) && this->isWriteBarrierEnabled)
        {
            RecyclerWriteBarrierManager::ToggleBarrier(this->address, this->segmentPageCount * AutoSystemInfo::PageSize, false);
        }
#endif
        RecyclerWriteBarrierManager::OnSegmentFree(this->address, this->segmentPageCount);
#endif
    }
}